

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

int snap_sunk_store2(GCtrace *T,IRIns *ira,IRIns *irs)

{
  IRIns *irk;
  IRIns *irs_local;
  IRIns *ira_local;
  GCtrace *T_local;
  uint local_4;
  
  if (((((irs->field_1).o == 'H') || ((irs->field_1).o == 'I')) || ((irs->field_1).o == 'K')) ||
     ((irs->field_1).o == 'L')) {
    irk = T->ir + (irs->field_0).op1;
    if (((irk->field_1).o == '8') || ((irk->field_1).o == '9')) {
      irk = T->ir + (irk->field_0).op1;
    }
    local_4 = (uint)(T->ir + (irk->field_0).op1 == ira);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int snap_sunk_store2(GCtrace *T, IRIns *ira, IRIns *irs)
{
  if (irs->o == IR_ASTORE || irs->o == IR_HSTORE ||
      irs->o == IR_FSTORE || irs->o == IR_XSTORE) {
    IRIns *irk = &T->ir[irs->op1];
    if (irk->o == IR_AREF || irk->o == IR_HREFK)
      irk = &T->ir[irk->op1];
    return (&T->ir[irk->op1] == ira);
  }
  return 0;
}